

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O3

void ihevc_sao_edge_offset_class3
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  UWORD8 UVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  UWORD8 *pUVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  UWORD8 UVar10;
  char cVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  byte *pbVar17;
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_left_tmp [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 *local_180;
  byte bStack_139;
  uint local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  char local_f8 [64];
  UWORD8 local_b8 [64];
  undefined1 local_78 [72];
  
  lVar5 = (long)wd;
  local_138 = 0xffffffff;
  uStack_134 = 0xffffffff;
  uStack_130 = 0xffffffff;
  uStack_12c = 0xffffffff;
  local_128 = 0xffffffff;
  uStack_124 = 0xffffffff;
  uStack_120 = 0xffffffff;
  uStack_11c = 0xffffffff;
  local_118 = 0xffffffff;
  uStack_114 = 0xffffffff;
  uStack_110 = 0xffffffff;
  uStack_10c = 0xffffffff;
  local_108 = 0xffffffff;
  uStack_104 = 0xffffffff;
  uStack_100 = 0xffffffff;
  uStack_fc = 0xffffffff;
  lVar8 = (long)src_strd;
  if (0 < ht) {
    pUVar6 = pu1_src + (long)wd + -1;
    uVar7 = 0;
    do {
      local_b8[uVar7] = *pUVar6;
      uVar7 = uVar7 + 1;
      pUVar6 = pUVar6 + lVar8;
    } while ((uint)ht != uVar7);
  }
  UVar1 = pu1_src_top[lVar5 + -1];
  uVar9 = lVar5 - 1;
  uVar7 = (ulong)(uint)wd;
  if (0 < wd) {
    memcpy(local_78,pu1_src + (ht + -1) * src_strd,uVar7);
  }
  bVar2 = pu1_src[uVar9];
  uVar15 = (uint)bVar2;
  if (pu1_avail[5] != '\0') {
    uVar3 = 1;
    if (*pu1_src_top_right <= bVar2) {
      uVar3 = bVar2 == *pu1_src_top_right ^ 3;
    }
    uVar4 = 0xffffffff;
    if (pu1_src[src_strd + -2 + wd] <= bVar2) {
      uVar4 = (uint)(bVar2 != pu1_src[src_strd + -2 + wd]);
    }
    if (uVar4 + uVar3 != 2) {
      uVar3 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar4 + uVar3]] + (uint)bVar2;
      uVar15 = 0xff;
      if (((int)uVar3 < 0x100) && (uVar15 = 0, 0 < (int)uVar3)) {
        uVar15 = uVar3;
      }
    }
  }
  iVar14 = ht + -1;
  bVar2 = pu1_src[iVar14 * src_strd];
  uVar3 = (uint)bVar2;
  if (pu1_avail[6] != '\0') {
    uVar4 = 1;
    if (pu1_src[(iVar14 * src_strd - src_strd) + 1] <= bVar2) {
      uVar4 = bVar2 == pu1_src[(iVar14 * src_strd - src_strd) + 1] ^ 3;
    }
    uVar13 = 0xffffffff;
    if (*pu1_src_bot_left <= bVar2) {
      uVar13 = (uint)(bVar2 != *pu1_src_bot_left);
    }
    if (uVar13 + uVar4 != 2) {
      uVar4 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar13 + uVar4]] + (uint)bVar2;
      uVar3 = 0xff;
      if (((int)uVar4 < 0x100) && (uVar3 = 0, 0 < (int)uVar4)) {
        uVar3 = uVar4;
      }
    }
  }
  if (*pu1_avail == '\0') {
    local_138 = local_138 & 0xffffff00;
  }
  UVar10 = pu1_avail[2];
  if (UVar10 == '\0') {
    pUVar6 = pu1_src + lVar8;
    local_180 = pu1_src_left + 1;
    ht = iVar14;
    if (1 < wd) {
      uVar12 = 0;
      do {
        cVar11 = pUVar6[uVar12] != pu1_src[uVar12 + 1];
        if (pUVar6[uVar12] < pu1_src[uVar12 + 1]) {
          cVar11 = -1;
        }
        local_f8[uVar12] = cVar11;
        uVar12 = uVar12 + 1;
      } while ((uVar9 & 0xffffffff) != uVar12);
    }
  }
  else {
    pUVar6 = pu1_src;
    local_180 = pu1_src_left;
    if (1 < wd) {
      uVar12 = 0;
      do {
        cVar11 = pu1_src[uVar12] != pu1_src_top[uVar12 + 1];
        if (pu1_src[uVar12] < pu1_src_top[uVar12 + 1]) {
          cVar11 = -1;
        }
        local_f8[uVar12] = cVar11;
        uVar12 = uVar12 + 1;
      } while ((uVar9 & 0xffffffff) != uVar12);
    }
  }
  if (pu1_avail[1] == '\0') {
    (&bStack_139)[lVar5] = 0;
  }
  uVar4 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < (int)uVar4) {
    uVar12 = 0;
    do {
      cVar11 = pUVar6[uVar9] != pUVar6[wd - src_strd];
      if (pUVar6[uVar9] < pUVar6[wd - src_strd]) {
        cVar11 = -1;
      }
      uVar12 = uVar12 + 1;
      local_f8[lVar5 + -1] = cVar11;
      if (0 < wd) {
        uVar16 = 0;
        do {
          bVar2 = pUVar6[uVar16];
          pbVar17 = pUVar6 + uVar16 + lVar8 + -1;
          if (uVar16 == 0) {
            pbVar17 = local_180 + uVar12;
          }
          uVar13 = (uint)(*pbVar17 < bVar2);
          if (bVar2 < *pbVar17) {
            uVar13 = 0xffffffff;
          }
          if (uVar16 != 0) {
            local_f8[uVar16 - 1] = -(char)uVar13;
          }
          uVar13 = (uint)*(byte *)((long)&local_138 + uVar16) &
                   gi4_ihevc_table_edge_idx[(long)local_f8[uVar16] + (long)(int)uVar13 + 2];
          if (uVar13 != 0) {
            iVar14 = (int)pi1_sao_offset[uVar13] + (uint)bVar2;
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            pUVar6[uVar16] = (UWORD8)iVar14;
          }
          uVar16 = uVar16 + 1;
        } while (uVar7 != uVar16);
      }
      pUVar6 = pUVar6 + lVar8;
    } while (uVar12 != uVar4);
    UVar10 = pu1_avail[2];
  }
  uVar13 = uVar4;
  if (UVar10 == '\0') {
    uVar13 = uVar4 + 1;
  }
  pUVar6[(int)(~(uVar13 * src_strd) + wd)] = (UWORD8)uVar15;
  lVar5 = 0;
  if (pu1_avail[3] != '\0') {
    lVar5 = (long)-src_strd;
  }
  pUVar6[lVar5] = (UWORD8)uVar3;
  if (pu1_avail[2] == '\0') {
    uVar4 = uVar4 + 1;
  }
  uVar4 = uVar4 + (pu1_avail[3] == '\0');
  *pu1_src_top_left = UVar1;
  if (0 < (int)uVar4) {
    memcpy(pu1_src_left,local_b8,(ulong)uVar4);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_78,uVar7);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_0_ht_tmp;
    UWORD8 u1_pos_wd_0_tmp;

    bit_depth = BIT_DEPTH_LUMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp = CLIP3(pu1_src[wd - 1] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 1 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_0_ht_tmp = pu1_src[(ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 1 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 1; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 1 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - ((col == 0) ? pu1_src_left_cpy[row + 1] :
                                                                 pu1_src[col - 1 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 0)
                    au1_sign_up[col - 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}